

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_base.h
# Opt level: O0

void density::detail::swap
               (LFQueue_Base<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
                *i_first,
               LFQueue_Base<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
               *i_second)

{
  LFQueue_Base<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
  *i_second_local;
  LFQueue_Base<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::detail::SpQueue_TailMultiple<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
  *i_first_local;
  
  std::swap<density::basic_default_allocator<65536ul>>
            ((basic_default_allocator<65536UL> *)i_first,
             (basic_default_allocator<65536UL> *)i_second);
  return;
}

Assistant:

void swap(LFQueue_Base & i_first, LFQueue_Base & i_second) noexcept
            {
                // swap the allocator
                using std::swap;
                static_assert(
                  noexcept(swap(
                    static_cast<ALLOCATOR_TYPE &>(i_first),
                    static_cast<ALLOCATOR_TYPE &>(i_second))),
                  "the allocator must be nowthrow swappable");
                swap(
                  static_cast<ALLOCATOR_TYPE &>(i_first), static_cast<ALLOCATOR_TYPE &>(i_second));
            }